

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O1

void __thiscall
TasGrid::GridLocalPolynomial::walkTree<0,(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this,MultiIndexSet *work,double *x,
          vector<int,_std::allocator<int>_> *sindx,vector<double,_std::allocator<double>_> *svals,
          double *y)

{
  int iVar1;
  size_t sVar2;
  pointer pdVar3;
  long lVar4;
  pointer piVar5;
  long lVar6;
  int *r;
  int *piVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  bool isSupported;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<double,_std::allocator<double>_> basis_derivative;
  bool local_92;
  allocator_type local_91;
  vector<int,_std::allocator<int>_> local_90;
  MultiIndexSet *local_78;
  double *local_70;
  vector<int,_std::allocator<int>_> local_68;
  int *local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_78 = work;
  local_70 = x;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_68,(long)this->top_level + 1,(allocator_type *)&local_90);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_90,(long)this->top_level + 1,(allocator_type *)&local_48);
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_48,(long)(this->super_BaseCanonicalGrid).num_dimensions,&local_91);
  piVar7 = (this->roots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_50 = (this->roots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (piVar7 != local_50) {
    do {
      dVar10 = evalBasisSupported<(TasGrid::RuleLocal::erule)3>
                         (this,(local_78->indexes).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start +
                               (long)*piVar7 * local_78->num_dimensions,local_70,&local_92);
      if (local_92 == true) {
        iVar9 = *piVar7;
        lVar4 = (long)(this->super_BaseCanonicalGrid).num_outputs;
        if (0 < lVar4) {
          sVar2 = (this->surpluses).stride;
          pdVar3 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          lVar8 = 0;
          do {
            y[lVar8] = pdVar3[sVar2 * (long)iVar9 + lVar8] * dVar10 + y[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar4 != lVar8);
        }
        *local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = iVar9;
        iVar9 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[*piVar7];
        *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = iVar9;
        piVar5 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (iVar9 < piVar5[(long)*local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + 1]) {
          iVar9 = 0;
          do {
            if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar9] <
                piVar5[(long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar9] + 1]) {
              iVar1 = (this->indx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar9]];
              lVar4 = (long)iVar1;
              dVar10 = evalBasisSupported<(TasGrid::RuleLocal::erule)3>
                                 (this,(local_78->indexes).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start +
                                       local_78->num_dimensions * lVar4,local_70,&local_92);
              if (local_92 == true) {
                lVar8 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                if (0 < lVar8) {
                  sVar2 = (this->surpluses).stride;
                  pdVar3 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  lVar6 = 0;
                  do {
                    y[lVar6] = pdVar3[sVar2 * lVar4 + lVar6] * dVar10 + y[lVar6];
                    lVar6 = lVar6 + 1;
                  } while (lVar8 != lVar6);
                }
                local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)iVar9 + 1] = iVar1;
                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)iVar9 + 1] =
                     (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar4];
                iVar9 = iVar9 + 1;
              }
              else {
                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar9] =
                     local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar9] + 1;
              }
            }
            else {
              local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[(long)iVar9 + -1] =
                   local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)iVar9 + -1] + 1;
              iVar9 = iVar9 + -1;
            }
            piVar5 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          } while (*local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start <
                   piVar5[(long)*local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + 1]);
        }
      }
      piVar7 = piVar7 + 1;
    } while (piVar7 != local_50);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void walkTree(const MultiIndexSet &work, const double x[], std::vector<int> &sindx, std::vector<double> &svals, double *y) const{
        std::vector<int> monkey_count(top_level+1); // traverse the tree, counts the branches of the current node
        std::vector<int> monkey_tail(top_level+1); // traverse the tree, keeps track of the previous node (history)

        bool isSupported;
        double basis_value;
        std::vector<double> basis_derivative(num_dimensions);

        for(const auto &r : roots){
            if (mode == 3 or mode == 4) {
                diffBasisSupported<effrule>(work.getIndex(r), x, basis_derivative.data(), isSupported);
            } else {
                basis_value = evalBasisSupported<effrule>(work.getIndex(r), x, isSupported);
            }

            if (isSupported){
                if (mode == 0){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        y[k] += basis_value * s[k];
                }else if (mode == 1 or mode == 2){
                    sindx.push_back(r);
                    svals.push_back(basis_value);
                }else if (mode == 3){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        for (int d=0; d<num_dimensions; d++)
                            y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                }else{
                    sindx.push_back(r);
                    for (auto dx : basis_derivative)
                        svals.push_back(dx);
                }

                int current = 0;
                monkey_tail[0] = r;
                monkey_count[0] = pntr[r];

                while(monkey_count[0] < pntr[monkey_tail[0]+1]){
                    if (monkey_count[current] < pntr[monkey_tail[current]+1]){
                        int p = indx[monkey_count[current]];
                        if (mode == 3 or mode == 4){
                            diffBasisSupported<effrule>(work.getIndex(p), x, basis_derivative.data(), isSupported);
                        }else{
                            basis_value = evalBasisSupported<effrule>(work.getIndex(p), x, isSupported);
                        }
                        if (isSupported){
                            if (mode == 0){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    y[k] += basis_value * s[k];
                            }else if (mode == 1 or mode == 2){
                                sindx.push_back(p);
                                svals.push_back(basis_value);
                            }else if (mode == 3){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    for (int d=0; d<num_dimensions; d++)
                                        y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                            }else{
                                sindx.push_back(p);
                                for (auto dx : basis_derivative)
                                    svals.push_back(dx);
                            }
                            monkey_tail[++current] = p;
                            monkey_count[current] = pntr[p];
                        }else{
                            monkey_count[current]++;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }

        // according to https://docs.nvidia.com/cuda/cusparse/index.html#sparse-format
        // "... it is assumed that the indices are provided in increasing order and that each index appears only once."
        // This may not be a requirement for cusparseDgemvi(), but it may be that I have not tested it sufficiently
        // Also, see AccelerationDataGPUFull::cusparseMatveci() for inaccuracies in Nvidia documentation
        if (mode == 2){
            std::vector<int> map(sindx);
            std::iota(map.begin(), map.end(), 0);
            std::sort(map.begin(), map.end(), [&](int a, int b)->bool{ return (sindx[a] < sindx[b]); });

            std::vector<int> idx = sindx;
            std::vector<double> vls = svals;
            std::transform(map.begin(), map.end(), sindx.begin(), [&](int i)->int{ return idx[i]; });
            std::transform(map.begin(), map.end(), svals.begin(), [&](int i)->double{ return vls[i]; });
        }
    }